

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::DFAContentModel::validateContent
          (DFAContentModel *this,QName **children,XMLSize_t childCount,uint param_3,
          XMLSize_t *indexFailingChild,MemoryManager *param_5)

{
  XMLCh XVar1;
  XMLCh XVar2;
  QName *this_00;
  QName *this_01;
  Occurence *pOVar3;
  NodeTypes NVar4;
  int iVar5;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  XMLSize_t XVar12;
  uint nextState;
  uint local_60;
  uint local_5c;
  XMLSize_t *local_58;
  uint nextLoop;
  uint local_48;
  uint local_44;
  XMLSize_t local_40;
  QName **local_38;
  
  if (childCount == 0) {
    if (this->fEmptyOk != false) {
      return true;
    }
    *indexFailingChild = 0;
  }
  else {
    nextState = 0;
    local_48 = 0xffffffff;
    local_60 = 0xffffffff;
    XVar12 = 0;
    local_5c = 0;
    uVar10 = 0;
    local_58 = indexFailingChild;
    local_40 = childCount;
    local_38 = children;
    do {
      this_00 = local_38[XVar12];
      if (this->fDTD == true) {
        pXVar6 = QName::getRawName(this_00);
      }
      else {
        pXVar6 = (XMLCh *)0x0;
      }
      if ((this->fIsMixed != true) || (this_00->fURIId != local_48)) {
        local_44 = uVar10;
        if (this->fElemMapSize == 0) {
          uVar10 = 0;
        }
        else {
          uVar9 = (ulong)local_5c;
          uVar11 = 0;
          do {
            this_01 = this->fElemMap[uVar11];
            if (this->fDTD == true) {
              pXVar7 = QName::getRawName(this_01);
              if (pXVar7 == pXVar6) goto LAB_002e8234;
              pXVar8 = pXVar6;
              if ((pXVar6 != (XMLCh *)0x0) && (pXVar7 != (XMLCh *)0x0)) {
                do {
                  XVar1 = *pXVar7;
                  if (XVar1 == L'\0') goto LAB_002e822e;
                  pXVar7 = pXVar7 + 1;
                  XVar2 = *pXVar8;
                  pXVar8 = pXVar8 + 1;
                } while (XVar1 == XVar2);
                goto LAB_002e8249;
              }
              if (pXVar7 == (XMLCh *)0x0) {
                if (pXVar6 == (XMLCh *)0x0) goto LAB_002e8234;
LAB_002e822e:
                XVar1 = *pXVar8;
              }
              else {
                XVar1 = *pXVar7;
                if ((pXVar6 != (XMLCh *)0x0) && (XVar1 == L'\0')) goto LAB_002e822e;
              }
joined_r0x002e827d:
              if (XVar1 == L'\0') {
LAB_002e8234:
                nextState = this->fTransTable[uVar9][uVar11];
                if (nextState != local_60) break;
              }
            }
            else if (this->fElemMapType[uVar11] == Leaf) {
              if (this_01->fURIId == this_00->fURIId) {
                pXVar7 = this_01->fLocalPart;
                pXVar8 = this_00->fLocalPart;
                if (pXVar7 == pXVar8) goto LAB_002e8234;
                if ((pXVar7 == (XMLCh *)0x0) || (pXVar8 == (XMLCh *)0x0)) {
                  if (pXVar7 == (XMLCh *)0x0) {
                    if (pXVar8 == (XMLCh *)0x0) goto LAB_002e8234;
                  }
                  else {
                    XVar1 = *pXVar7;
                    if ((pXVar8 == (XMLCh *)0x0) || (XVar1 != L'\0')) goto joined_r0x002e827d;
                  }
LAB_002e8279:
                  XVar1 = *pXVar8;
                  goto joined_r0x002e827d;
                }
                do {
                  XVar1 = *pXVar7;
                  if (XVar1 == L'\0') goto LAB_002e8279;
                  pXVar7 = pXVar7 + 1;
                  XVar2 = *pXVar8;
                  pXVar8 = pXVar8 + 1;
                } while (XVar1 == XVar2);
              }
            }
            else {
              NVar4 = this->fElemMapType[uVar11] & (Any_NS|Any_Other);
              if (NVar4 == Any_NS) {
                if (this_01->fURIId == this_00->fURIId) goto LAB_002e8234;
              }
              else if (NVar4 == Any_Other) {
                if ((this_00->fURIId != 1) && (this_00->fURIId != this_01->fURIId))
                goto LAB_002e8234;
              }
              else if (NVar4 == Any) goto LAB_002e8234;
            }
LAB_002e8249:
            uVar11 = uVar11 + 1;
          } while (uVar11 < this->fElemMapSize);
          uVar10 = (uint)uVar11;
          childCount = local_40;
        }
        if ((nextState == local_60) || (uVar10 == this->fElemMapSize)) goto LAB_002e8318;
        nextLoop = 0;
        iVar5 = (*(this->super_XMLContentModel)._vptr_XMLContentModel[7])
                          (this,this_00,(ulong)local_5c,(ulong)local_44,&nextState,&nextLoop,
                           (ulong)uVar10,0);
        if ((char)iVar5 == '\0') goto LAB_002e8318;
        local_5c = nextState;
        nextState = 0;
        uVar10 = nextLoop;
      }
      XVar12 = (XMLSize_t)((int)XVar12 + 1);
    } while (XVar12 < childCount);
    if (this->fFinalStateFlags[local_5c] != false) {
      if (this->fCountingStates == (Occurence **)0x0) {
        return true;
      }
      pOVar3 = this->fCountingStates[local_5c];
      if (pOVar3 == (Occurence *)0x0) {
        return true;
      }
      if ((uint)pOVar3->minOccurs <= uVar10) {
        return true;
      }
    }
LAB_002e8318:
    *local_58 = XVar12;
  }
  return false;
}

Assistant:

bool
DFAContentModel::validateContent( QName** const        children
                                , XMLSize_t            childCount
                                , unsigned int
                                , XMLSize_t*           indexFailingChild
                                , MemoryManager*    const) const
{
    //
    //  If there are no children, then either we fail on the 0th element
    //  or we return success. It depends upon whether this content model
    //  accepts empty content, which we determined earlier.
    //
    if (!childCount)
    {
        // success
        if(fEmptyOk)
            return true;
        *indexFailingChild=0;
        return false;
    }

    //
    //  Lets loop through the children in the array and move our way
    //  through the states. Note that we use the fElemMap array to map
    //  an element index to a state index.
    //
    unsigned int curState = 0;
    unsigned int nextState = 0;
    unsigned int loopCount = 0;
    unsigned int childIndex = 0;
    for (; childIndex < childCount; childIndex++)
    {
        // Get the current element index out
        const QName* curElem = children[childIndex];
        const XMLCh* curElemRawName = 0;
        if (fDTD)
            curElemRawName = curElem->getRawName();

        // If this is text in a Schema mixed content model, skip it.
        if ( fIsMixed &&
            ( curElem->getURI() == XMLElementDecl::fgPCDataElemId))
            continue;

        // Look up this child in our element map
        unsigned int elemIndex = 0;
        for (; elemIndex < fElemMapSize; elemIndex++)
        {
            const QName* inElem  = fElemMap[elemIndex];
            if (fDTD) {
                if (XMLString::equals(inElem->getRawName(), curElemRawName)) {
                    nextState = fTransTable[curState][elemIndex];
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }
            else {
                ContentSpecNode::NodeTypes type = fElemMapType[elemIndex];
                if (type == ContentSpecNode::Leaf)
                {
                    if ((inElem->getURI() == curElem->getURI()) &&
                    (XMLString::equals(inElem->getLocalPart(), curElem->getLocalPart()))) {
                        nextState = fTransTable[curState][elemIndex];
                        if (nextState != XMLContentModel::gInvalidTrans)
                            break;
                    }
                }
                else if ((type & 0x0f)== ContentSpecNode::Any)
                {
                    nextState = fTransTable[curState][elemIndex];
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
                else if ((type & 0x0f) == ContentSpecNode::Any_NS)
                {
                    if (inElem->getURI() == curElem->getURI())
                    {
                        nextState = fTransTable[curState][elemIndex];
                        if (nextState != XMLContentModel::gInvalidTrans)
                            break;
                    }
                }
                else if ((type & 0x0f) == ContentSpecNode::Any_Other)
                {
                    // Here we assume that empty string has id 1.
                    //
                    unsigned int uriId = curElem->getURI();
                    if (uriId != 1 && uriId != inElem->getURI()) {
                        nextState = fTransTable[curState][elemIndex];
                        if (nextState != XMLContentModel::gInvalidTrans)
                            break;
                    }
                }
            }
        }//for elemIndex

        // If "nextState" is -1, we found a match, but the transition is invalid
        if (nextState == XMLContentModel::gInvalidTrans)
        {
            *indexFailingChild=childIndex;
            return false;
        }

        // If we didn't find it, then obviously not valid
        if (elemIndex == fElemMapSize)
        {
            *indexFailingChild=childIndex;
            return false;
        }

        unsigned int nextLoop = 0;
        if(!handleRepetitions(curElem, curState, loopCount, nextState, nextLoop, elemIndex, 0))
        {
            *indexFailingChild=childIndex;
            return false;
        }

        curState = nextState;
        loopCount = nextLoop;
        nextState = 0;

    }//for childIndex

    //
    //  We transitioned all the way through the input list. However, that
    //  does not mean that we ended in a final state. So check whether
    //  our ending state is a final state.
    //
    if (!fFinalStateFlags[curState])
    {
        *indexFailingChild=childIndex;
        return false;
    }

    // verify if we exited before the minOccurs was satisfied
    if (fCountingStates != 0) {
        Occurence* o = fCountingStates[curState];
        if (o != 0 && loopCount < (unsigned int)o->minOccurs) {
            // not enough loops on the current state to be considered final.
            *indexFailingChild=childIndex;
            return false;
        }
    }

    //success
    return true;
}